

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool scan_heredoc_end_identifier(Heredoc *heredoc,TSLexer *lexer)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  uint uVar5;
  ulong __n;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar6;
  _Bool _Var7;
  
  __n = (ulong)(heredoc->current_leading_word).size;
  if (__n != 0) {
    memset((heredoc->current_leading_word).contents,0,__n);
    (heredoc->current_leading_word).size = 0;
    __n = extraout_RDX;
  }
  if ((heredoc->delimiter).size != 0) {
    uVar6 = 0;
    while ((uVar1 = lexer->lookahead, uVar1 != 0 && (uVar1 != 10))) {
      uVar2 = (heredoc->delimiter).size;
      if (uVar2 <= uVar6) {
        __assert_fail("(uint32_t)(size) < (&heredoc->delimiter)->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                      ,0xe9,"_Bool scan_heredoc_end_identifier(Heredoc *, TSLexer *)");
      }
      uVar5 = (uint)(heredoc->delimiter).contents[uVar6];
      __n = (ulong)uVar5;
      if ((uVar1 != uVar5) || (uVar2 <= (heredoc->current_leading_word).size)) break;
      _array__grow((Array *)&heredoc->current_leading_word,1,__n);
      iVar3 = lexer->lookahead;
      uVar1 = (heredoc->current_leading_word).size;
      (heredoc->current_leading_word).size = uVar1 + 1;
      (heredoc->current_leading_word).contents[uVar1] = (char)iVar3;
      (*lexer->advance)(lexer,false);
      uVar6 = uVar6 + 1;
      __n = extraout_RDX_00;
    }
  }
  _array__grow((Array *)&heredoc->current_leading_word,1,__n);
  uVar1 = (heredoc->current_leading_word).size;
  (heredoc->current_leading_word).size = uVar1 + 1;
  (heredoc->current_leading_word).contents[uVar1] = '\0';
  if ((heredoc->delimiter).size == 0) {
    _Var7 = false;
  }
  else {
    iVar4 = strcmp((heredoc->current_leading_word).contents,(heredoc->delimiter).contents);
    _Var7 = iVar4 == 0;
  }
  return _Var7;
}

Assistant:

static bool scan_heredoc_end_identifier(Heredoc *heredoc, TSLexer *lexer) {
    reset_string(&heredoc->current_leading_word);
    // Scan the first 'n' characters on this line, to see if they match the
    // heredoc delimiter
    int32_t size = 0;
    if (heredoc->delimiter.size > 0) {
        while (lexer->lookahead != '\0' && lexer->lookahead != '\n' &&
               (int32_t)*array_get(&heredoc->delimiter, size) == lexer->lookahead &&
               heredoc->current_leading_word.size < heredoc->delimiter.size) {
            array_push(&heredoc->current_leading_word, lexer->lookahead);
            advance(lexer);
            size++;
        }
    }
    array_push(&heredoc->current_leading_word, '\0');
    return heredoc->delimiter.size == 0
               ? false
               : strcmp(heredoc->current_leading_word.contents, heredoc->delimiter.contents) == 0;
}